

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O1

int jpc_dec_tilefini(jpc_dec_t *dec,jpc_dec_tile_t *tile)

{
  jpc_dec_seg_s *pjVar1;
  jpc_dec_seg_t *pjVar2;
  jpc_dec_tcomp_t *pjVar3;
  jpc_dec_seg_s *pjVar4;
  int iVar5;
  jpc_dec_rlvl_t *pjVar6;
  int iVar7;
  uint uVar8;
  jpc_dec_prc_t *pjVar9;
  jpc_dec_seg_t *seg;
  jpc_dec_cblk_t *pjVar10;
  int iVar11;
  jpc_dec_band_t *pjVar12;
  int iVar13;
  
  pjVar3 = tile->tcomps;
  if ((pjVar3 != (jpc_dec_tcomp_t *)0x0) && (0 < dec->numcomps)) {
    iVar5 = 0;
    do {
      if (pjVar3->numrlvls != 0) {
        pjVar6 = pjVar3->rlvls;
        uVar8 = 0;
        do {
          pjVar12 = pjVar6->bands;
          if (pjVar12 != (jpc_dec_band_t *)0x0) {
            if (0 < pjVar6->numbands) {
              iVar7 = 0;
              do {
                pjVar9 = pjVar12->prcs;
                if ((pjVar9 != (jpc_dec_prc_t *)0x0) && (0 < pjVar6->numprcs)) {
                  iVar13 = 0;
                  do {
                    pjVar10 = pjVar9->cblks;
                    if (pjVar10 != (jpc_dec_cblk_t *)0x0) {
                      if (0 < pjVar9->numcblks) {
                        iVar11 = 0;
                        do {
                          seg = (pjVar10->segs).head;
                          if (seg != (jpc_dec_seg_t *)0x0) {
                            do {
                              pjVar1 = seg->prev;
                              pjVar4 = pjVar1;
                              if (pjVar1 == (jpc_dec_seg_s *)0x0) {
                                pjVar4 = (jpc_dec_seg_s *)&pjVar10->segs;
                              }
                              pjVar2 = seg->next;
                              pjVar4->next = pjVar2;
                              if (pjVar2 == (jpc_dec_seg_t *)0x0) {
                                pjVar2 = (jpc_dec_seg_t *)&pjVar10->segs;
                              }
                              pjVar2->prev = pjVar1;
                              seg->next = (jpc_dec_seg_s *)0x0;
                              seg->prev = (jpc_dec_seg_s *)0x0;
                              jpc_seg_destroy(seg);
                              seg = (pjVar10->segs).head;
                            } while (seg != (jpc_dec_seg_t *)0x0);
                          }
                          jas_matrix_destroy(pjVar10->data);
                          if (pjVar10->mqdec != (jpc_mqdec_t *)0x0) {
                            jpc_mqdec_destroy(pjVar10->mqdec);
                          }
                          if (pjVar10->nulldec != (jpc_bitstream_t *)0x0) {
                            jpc_bitstream_close(pjVar10->nulldec);
                          }
                          if (pjVar10->flags != (jas_matrix_t *)0x0) {
                            jas_matrix_destroy(pjVar10->flags);
                          }
                          iVar11 = iVar11 + 1;
                          pjVar10 = pjVar10 + 1;
                        } while (iVar11 < pjVar9->numcblks);
                      }
                      if (pjVar9->incltagtree != (jpc_tagtree_t *)0x0) {
                        jpc_tagtree_destroy(pjVar9->incltagtree);
                      }
                      if (pjVar9->numimsbstagtree != (jpc_tagtree_t *)0x0) {
                        jpc_tagtree_destroy(pjVar9->numimsbstagtree);
                      }
                      if (pjVar9->cblks != (jpc_dec_cblk_t *)0x0) {
                        jas_free(pjVar9->cblks);
                      }
                    }
                    iVar13 = iVar13 + 1;
                    pjVar9 = pjVar9 + 1;
                  } while (iVar13 < pjVar6->numprcs);
                }
                if (pjVar12->data != (jas_matrix_t *)0x0) {
                  jas_matrix_destroy(pjVar12->data);
                }
                if (pjVar12->prcs != (jpc_dec_prc_t *)0x0) {
                  jas_free(pjVar12->prcs);
                }
                iVar7 = iVar7 + 1;
                pjVar12 = pjVar12 + 1;
              } while (iVar7 < pjVar6->numbands);
            }
            if (pjVar6->bands != (jpc_dec_band_t *)0x0) {
              jas_free(pjVar6->bands);
            }
          }
          uVar8 = uVar8 + 1;
          pjVar6 = pjVar6 + 1;
        } while (uVar8 < pjVar3->numrlvls);
      }
      if (pjVar3->rlvls != (jpc_dec_rlvl_t *)0x0) {
        jas_free(pjVar3->rlvls);
      }
      if (pjVar3->data != (jas_matrix_t *)0x0) {
        jas_matrix_destroy(pjVar3->data);
      }
      if (pjVar3->tsfb != (jpc_tsfb_t *)0x0) {
        jpc_tsfb_destroy(pjVar3->tsfb);
      }
      iVar5 = iVar5 + 1;
      pjVar3 = pjVar3 + 1;
    } while (iVar5 < dec->numcomps);
  }
  if (tile->cp != (jpc_dec_cp_t *)0x0) {
    jpc_dec_cp_destroy(tile->cp);
  }
  if (tile->tcomps != (jpc_dec_tcomp_t *)0x0) {
    jas_free(tile->tcomps);
  }
  if (tile->pi != (jpc_pi_t *)0x0) {
    jpc_pi_destroy(tile->pi);
  }
  if (tile->pkthdrstream != (jas_stream_t *)0x0) {
    jas_stream_close(tile->pkthdrstream);
  }
  if (tile->pptstab != (jpc_ppxstab_t *)0x0) {
    jpc_ppxstab_destroy(tile->pptstab);
  }
  tile->state = 3;
  return (int)tile;
}

Assistant:

static int jpc_dec_tilefini(jpc_dec_t *dec, jpc_dec_tile_t *tile)
{
	jpc_dec_tcomp_t *tcomp;
	int compno;
	int bandno;
	unsigned rlvlno;
	jpc_dec_band_t *band;
	jpc_dec_rlvl_t *rlvl;
	int prcno;
	jpc_dec_prc_t *prc;
	jpc_dec_seg_t *seg;
	jpc_dec_cblk_t *cblk;
	int cblkno;

	if (tile->tcomps) {

		for (compno = 0, tcomp = tile->tcomps; compno < dec->numcomps;
		  ++compno, ++tcomp) {
			for (rlvlno = 0, rlvl = tcomp->rlvls; rlvlno < tcomp->numrlvls;
			  ++rlvlno, ++rlvl) {
				if (!rlvl->bands) {
					continue;
				}
				for (bandno = 0, band = rlvl->bands; bandno < rlvl->numbands;
				  ++bandno, ++band) {
					if (band->prcs) {
						for (prcno = 0, prc = band->prcs; prcno <
						  rlvl->numprcs; ++prcno, ++prc) {
							if (!prc->cblks) {
								continue;
							}
							for (cblkno = 0, cblk = prc->cblks; cblkno <
							  prc->numcblks; ++cblkno, ++cblk) {

								while (cblk->segs.head) {
									seg = cblk->segs.head;
									jpc_seglist_remove(&cblk->segs, seg);
									jpc_seg_destroy(seg);
								}
								jas_matrix_destroy(cblk->data);
								if (cblk->mqdec) {
									jpc_mqdec_destroy(cblk->mqdec);
								}
								if (cblk->nulldec) {
									jpc_bitstream_close(cblk->nulldec);
								}
								if (cblk->flags) {
									jas_matrix_destroy(cblk->flags);
								}
							}
							if (prc->incltagtree) {
								jpc_tagtree_destroy(prc->incltagtree);
							}
							if (prc->numimsbstagtree) {
								jpc_tagtree_destroy(prc->numimsbstagtree);
							}
							if (prc->cblks) {
								jas_free(prc->cblks);
							}
						}
					}
					if (band->data) {
						jas_matrix_destroy(band->data);
					}
					if (band->prcs) {
						jas_free(band->prcs);
					}
				}
				if (rlvl->bands) {
					jas_free(rlvl->bands);
				}
			}
			if (tcomp->rlvls) {
				jas_free(tcomp->rlvls);
			}
			if (tcomp->data) {
				jas_matrix_destroy(tcomp->data);
			}
			if (tcomp->tsfb) {
				jpc_tsfb_destroy(tcomp->tsfb);
			}
		}
	}

	if (tile->cp) {
		jpc_dec_cp_destroy(tile->cp);
		//tile->cp = 0;
	}
	if (tile->tcomps) {
		jas_free(tile->tcomps);
		//tile->tcomps = 0;
	}
	if (tile->pi) {
		jpc_pi_destroy(tile->pi);
		//tile->pi = 0;
	}
	if (tile->pkthdrstream) {
		jas_stream_close(tile->pkthdrstream);
		//tile->pkthdrstream = 0;
	}
	if (tile->pptstab) {
		jpc_ppxstab_destroy(tile->pptstab);
		//tile->pptstab = 0;
	}

	tile->state = JPC_TILE_DONE;

	return 0;
}